

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_group.hpp
# Opt level: O1

void __thiscall asio::detail::thread_group::join(thread_group *this)

{
  pthread_t *ppVar1;
  
  ppVar1 = *(pthread_t **)this;
  while (ppVar1 != (pthread_t *)0x0) {
    if ((char)ppVar1[1] == '\0') {
      pthread_join(*ppVar1,(void **)0x0);
      *(undefined1 *)(ppVar1 + 1) = 1;
    }
    ppVar1 = *(pthread_t **)this;
    *(pthread_t *)this = ppVar1[2];
    if (ppVar1 != (pthread_t *)0x0) {
      if ((char)ppVar1[1] == '\0') {
        pthread_detach(*ppVar1);
      }
      operator_delete(ppVar1);
    }
    ppVar1 = *(pthread_t **)this;
  }
  return;
}

Assistant:

void join()
  {
    while (first_)
    {
      first_->thread_.join();
      item* tmp = first_;
      first_ = first_->next_;
      delete tmp;
    }
  }